

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
irwincolor::sortidx<double>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *v)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  uint uVar9;
  int iVar12;
  undefined1 auVar11 [16];
  allocator_type local_21;
  undefined1 auVar10 [16];
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_21);
  auVar4 = _DAT_00143130;
  auVar3 = _DAT_001430e0;
  auVar2 = _DAT_001430d0;
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar5 = ((long)__last._M_current - (long)__first._M_current) - 4;
    auVar11._8_4_ = (int)uVar5;
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = (int)(uVar5 >> 0x20);
    auVar7._0_8_ = uVar5 >> 2;
    auVar7._8_8_ = auVar11._8_8_ >> 2;
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_001430e0;
    do {
      uVar9 = (uint)uVar6;
      auVar10._8_4_ = uVar9;
      auVar10._0_8_ = uVar6;
      auVar10._12_4_ = (int)(uVar6 >> 0x20);
      auVar11 = (auVar10 | auVar2) ^ auVar3;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_)
                & 1)) {
        __first._M_current[uVar6] = uVar9;
      }
      if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
          auVar11._12_4_ <= auVar7._12_4_) {
        __first._M_current[uVar6 + 1] = uVar9 + 1;
      }
      auVar11 = (auVar10 | auVar4) ^ auVar3;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
        __first._M_current[uVar6 + 2] = uVar9 + 2;
        __first._M_current[uVar6 + 3] = uVar9 + 3;
      }
      uVar6 = uVar6 + 4;
    } while (((uVar5 >> 2) + 4 & 0xfffffffffffffffc) != uVar6);
    uVar5 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<irwincolor::sortidx<double>(std::vector<double,std::allocator<double>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JeffIrwin[P]maph_submodules_colormapper___sort_h:20:36)>
                )v);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<irwincolor::sortidx<double>(std::vector<double,std::allocator<double>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JeffIrwin[P]maph_submodules_colormapper___sort_h:20:36)>
                )v);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> sortidx(const std::vector<T>& v)
{
	// Instead of sorting a vector v, sort an index array that gives
	// the ascending sorted values v[idx[0: ]].

	// initialize original index locations
	std::vector<unsigned int> idx(v.size());
	std::iota(idx.begin(), idx.end(), 0);

	// sort indices based on comparing values in v
	std::sort(idx.begin(), idx.end(), [&v](unsigned int i1, unsigned int i2) {return v[i1] < v[i2];});

	return idx;
}